

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOut(BailOutRecord *bailOutRecord)

{
  RecyclableObject *this;
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags savedImplicitCallFlags_00;
  uint32 uVar3;
  undefined4 *puVar4;
  JavascriptCallStackLayout *layout_00;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  JavascriptExceptionObject *pJVar7;
  void *unaff_retaddr;
  ImplicitCallFlags savedImplicitCallFlags;
  ScriptFunction *function;
  JavascriptCallStackLayout *layout;
  void *argoutRestoreAddr;
  BailOutRecord *bailOutRecord_local;
  
  if (bailOutRecord == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x432,"(bailOutRecord)","bailOutRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  layout_00 = GetStackLayout(bailOutRecord);
  this = *(RecyclableObject **)layout_00;
  pSVar5 = Js::RecyclableObject::GetScriptContext(this);
  pTVar6 = Js::ScriptContext::GetThreadContext(pSVar5);
  pJVar7 = ThreadContext::GetPendingFinallyException(pTVar6);
  if ((pJVar7 != (JavascriptExceptionObject *)0x0) &&
     (bailOutRecord->bailOutKind != BailOutOnException)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x443,
                       "(function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr || bailOutRecord->bailOutKind == IR::BailOutOnException)"
                       ,
                       "function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr || bailOutRecord->bailOutKind == IR::BailOutOnException"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (bailOutRecord->bailOutKind == BailOutOnImplicitCalls) {
    pSVar5 = Js::RecyclableObject::GetScriptContext(this);
    pTVar6 = Js::ScriptContext::GetThreadContext(pSVar5);
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(pTVar6);
  }
  pSVar5 = Js::RecyclableObject::GetScriptContext(this);
  pTVar6 = Js::ScriptContext::GetThreadContext(pSVar5);
  savedImplicitCallFlags_00 = ThreadContext::GetImplicitCallFlags(pTVar6);
  if (((byte)bailOutRecord->globalBailOutRecordTable->field_0x2c >> 2 & 1) == 0) {
    if ((bailOutRecord->globalBailOutRecordTable->field_0x2c & 1) == 0) {
      bailOutRecord_local =
           (BailOutRecord *)
           BailOutFromFunction(layout_00,bailOutRecord,unaff_retaddr,(void *)0x0,
                               savedImplicitCallFlags_00);
    }
    else {
      bailOutRecord_local =
           (BailOutRecord *)
           BailOutInlined(layout_00,bailOutRecord,unaff_retaddr,savedImplicitCallFlags_00);
    }
  }
  else if ((bailOutRecord->globalBailOutRecordTable->field_0x2c & 1) == 0) {
    uVar3 = BailOutFromLoopBody(layout_00,bailOutRecord);
    bailOutRecord_local = (BailOutRecord *)(ulong)uVar3;
  }
  else {
    uVar3 = BailOutFromLoopBodyInlined(layout_00,bailOutRecord,unaff_retaddr);
    bailOutRecord_local = (BailOutRecord *)(ulong)uVar3;
  }
  return bailOutRecord_local;
}

Assistant:

Js::Var BailOutRecord::BailOut(BailOutRecord const * bailOutRecord)
{
    Assert(bailOutRecord);

    void * argoutRestoreAddr = nullptr;
#ifdef _M_IX86
    void * addressOfRetAddress = _AddressOfReturnAddress();
    if (bailOutRecord->ehBailoutData && (bailOutRecord->ehBailoutData->catchOffset != 0 || bailOutRecord->ehBailoutData->finallyOffset != 0 || bailOutRecord->ehBailoutData->ht == Js::HandlerType::HT_Finally))
    {
        // For a bailout in argument evaluation from an EH region, the esp is offset by the TryCatch helper's frame. So, the argouts are not at the offsets
        // stored in the bailout record, which are relative to ebp. Need to restore the argouts from the actual value of esp before calling the Bailout helper
        argoutRestoreAddr = (void *)((char*)addressOfRetAddress + ((1 + 1) * MachPtr)); // Account for the parameter and return address of this function
    }
#endif

    Js::JavascriptCallStackLayout *const layout = bailOutRecord->GetStackLayout();
    Js::ScriptFunction * function = (Js::ScriptFunction *)layout->functionObject;

    Assert(function->GetScriptContext()->GetThreadContext()->GetPendingFinallyException() == nullptr ||
        bailOutRecord->bailOutKind == IR::BailOutOnException);

    if (bailOutRecord->bailOutKind == IR::BailOutOnImplicitCalls)
    {
        function->GetScriptContext()->GetThreadContext()->CheckAndResetImplicitCallAccessorFlag();
    }

    Js::ImplicitCallFlags savedImplicitCallFlags = function->GetScriptContext()->GetThreadContext()->GetImplicitCallFlags();

    if(bailOutRecord->globalBailOutRecordTable->isLoopBody)
    {
        if (bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
        {
            return reinterpret_cast<Js::Var>(BailOutFromLoopBodyInlined(layout, bailOutRecord, _ReturnAddress()));
        }
        return reinterpret_cast<Js::Var>(BailOutFromLoopBody(layout, bailOutRecord));
    }
    if(bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
    {
        return BailOutInlined(layout, bailOutRecord, _ReturnAddress(), savedImplicitCallFlags);
    }
    return BailOutFromFunction(layout, bailOutRecord, _ReturnAddress(), argoutRestoreAddr, savedImplicitCallFlags);
}